

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

KeywordTypeSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::KeywordTypeSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  KeywordTypeSyntax *pKVar7;
  
  pKVar7 = (KeywordTypeSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((KeywordTypeSyntax *)this->endPtr < pKVar7 + 1) {
    pKVar7 = (KeywordTypeSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pKVar7 + 1);
  }
  SVar1 = *args;
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pKVar7->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pKVar7->super_DataTypeSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar1;
  (pKVar7->keyword).kind = TVar3;
  (pKVar7->keyword).field_0x2 = uVar4;
  (pKVar7->keyword).numFlags = (NumericTokenFlags)NVar5.raw;
  (pKVar7->keyword).rawLen = uVar6;
  (pKVar7->keyword).info = pIVar2;
  return pKVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }